

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O0

void Saig_CollectSatValues(sat_solver *pSat,Cnf_Dat_t *pCnf,Vec_Ptr_t *vInfo,int *piPat)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pObj_00;
  uint *p;
  int local_3c;
  int i;
  uint *pInfo;
  Aig_Obj_t *pObj;
  int *piPat_local;
  Vec_Ptr_t *vInfo_local;
  Cnf_Dat_t *pCnf_local;
  sat_solver *pSat_local;
  
  local_3c = 0;
  do {
    iVar1 = Vec_PtrSize(pCnf->pMan->vObjs);
    if (iVar1 <= local_3c) {
      return;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pCnf->pMan->vObjs,local_3c);
    if ((pObj_00 != (Aig_Obj_t *)0x0) &&
       ((iVar1 = Aig_ObjIsNode(pObj_00), iVar1 != 0 || (iVar1 = Aig_ObjIsCi(pObj_00), iVar1 != 0))))
    {
      if (pCnf->pVarNums[local_3c] < 1) {
        __assert_fail("pCnf->pVarNums[i] > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigConstr2.c"
                      ,0x1fa,
                      "void Saig_CollectSatValues(sat_solver *, Cnf_Dat_t *, Vec_Ptr_t *, int *)");
      }
      p = (uint *)Vec_PtrEntry(vInfo,local_3c);
      iVar1 = Abc_InfoHasBit(p,*piPat);
      iVar2 = sat_solver_var_value(pSat,pCnf->pVarNums[local_3c]);
      if (iVar1 != iVar2) {
        Abc_InfoXorBit(p,*piPat);
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

void Saig_CollectSatValues( sat_solver * pSat, Cnf_Dat_t * pCnf, Vec_Ptr_t * vInfo, int * piPat )
{
    Aig_Obj_t * pObj;
    unsigned * pInfo;
    int i;
    Aig_ManForEachObj( pCnf->pMan, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        assert( pCnf->pVarNums[i] > 0 );
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, i );
        if ( Abc_InfoHasBit(pInfo, *piPat) != sat_solver_var_value(pSat, pCnf->pVarNums[i]) )
            Abc_InfoXorBit(pInfo, *piPat);
    }
}